

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::copy
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  BufHdr *pBVar1;
  long lVar2;
  C *pCVar3;
  EVP_PKEY_CTX *pEVar4;
  long lVar5;
  EVP_PKEY_CTX *length;
  bool bVar6;
  
  if (((EVP_PKEY_CTX *)
       (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p != dst) ||
     (length = (EVP_PKEY_CTX *)
               (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length,
     length != src && src != (EVP_PKEY_CTX *)0xffffffffffffffff)) {
    length = src;
    if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
      if (dst == (EVP_PKEY_CTX *)0x0) {
        length = (EVP_PKEY_CTX *)0x0;
      }
      else {
        lVar5 = -4;
        do {
          lVar2 = lVar5 + 4;
          lVar5 = lVar5 + 4;
        } while (*(int *)(dst + lVar2) != 0);
        length = (EVP_PKEY_CTX *)(lVar5 >> 2);
      }
    }
    pBVar1 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr;
    if (length == (EVP_PKEY_CTX *)0x0) {
      if (pBVar1 != (BufHdr *)0x0) {
        if ((pBVar1->super_RefCount).m_refCount == 1) {
          (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p =
               (C *)(pBVar1 + 1);
          *(undefined4 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
          (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length = 0;
        }
        else {
          StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
                    (&this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>);
        }
      }
      length = (EVP_PKEY_CTX *)0x0;
    }
    else if ((pBVar1 == (BufHdr *)0x0) ||
            (pEVar4 = (EVP_PKEY_CTX *)
                      ((long)&pBVar1[1].super_RefCount._vptr_RefCount + pBVar1->m_bufferSize),
            pEVar4 <= dst || dst < pBVar1 + 1)) {
      pCVar3 = createBuffer(this,(size_t)length,false);
      if (pCVar3 == (C *)0x0) {
        length = (EVP_PKEY_CTX *)0xffffffffffffffff;
      }
      else {
        __wrap_memcpy((this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p
                      ,dst,(long)length * 4);
      }
    }
    else {
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p = (C *)dst;
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length =
           (size_t)length;
      if (dst + (long)length * 4 < pEVar4) {
        bVar6 = *(int *)(dst + (long)length * 4) == 0;
      }
      else {
        bVar6 = false;
      }
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_isNullTerminated
           = bVar6;
    }
  }
  return (int)length;
}

Assistant:

size_t
	copy(
		const C* p,
		size_t length = -1
	) {
		if (p == this->m_p && (length == -1 || length == this->m_length))
			return this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		if (this->m_hdr && this->m_hdr->isInsideBuffer(p)) {
			C* end = (C*)this->m_hdr->getEnd();
			ASSERT(p + length <= end);

			this->m_p = (C*)p;
			this->m_length = length;
			this->m_isNullTerminated = p + length < end && !p[length];
			return length;
		}

		if (!createBuffer(length, false))
			return -1;

		Details::copy(this->m_p, p, length);
		return length;
	}